

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O1

void __thiscall
slang::ast::CoverCrossSymbol::addBody(CoverCrossSymbol *this,CoverCrossSyntax *syntax,Scope *scope)

{
  pointer pCVar1;
  size_t sVar2;
  pointer ppCVar3;
  long lVar4;
  pointer ppMVar5;
  CoverageOptionSyntax *syntax_00;
  string_view name;
  Compilation *this_00;
  SourceLocation *args_1;
  Scope *this_01;
  int iVar6;
  CoverCrossBodySymbol *pCVar7;
  Type *fieldType;
  TypeAliasType *pTVar8;
  QueueType *pQVar9;
  undefined4 extraout_var;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  size_t extraout_RDX_01;
  long lVar10;
  LookupLocation lookupLocation;
  StructBuilder valType;
  OptionBuilder optionBuilder;
  StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>,_96UL,_16UL>
  local_258;
  CoverCrossSymbol *local_250;
  Compilation *local_248;
  SourceLocation *local_240;
  Scope *local_238;
  CoverCrossBodySymbol *local_230;
  CoverCrossSyntax *local_228;
  Scope *local_220;
  StructBuilder local_218;
  undefined1 local_1f8 [240];
  undefined8 local_108;
  long local_100;
  undefined1 *local_f8;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>
  *ppStack_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined1 local_d8 [112];
  undefined8 local_68;
  long local_60;
  undefined1 *local_58;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>
  *ppStack_50;
  undefined8 local_48;
  undefined8 local_40;
  
  local_248 = scope->compilation;
  local_240 = &(this->super_Symbol).location;
  local_228 = syntax;
  pCVar7 = BumpAllocator::
           emplace<slang::ast::CoverCrossBodySymbol,slang::ast::Compilation&,slang::SourceLocation&>
                     (&local_248->super_BumpAllocator,local_248,local_240);
  local_238 = &this->super_Scope;
  Scope::insertMember(local_238,&pCVar7->super_Symbol,(this->super_Scope).lastMember,false,true);
  local_220 = &pCVar7->super_Scope;
  lookupLocation._12_4_ = 0;
  lookupLocation.scope = (Scope *)0x0;
  lookupLocation.index = 0;
  local_230 = pCVar7;
  StructBuilder::StructBuilder(&local_218,local_220,lookupLocation);
  sVar2 = (this->targets)._M_extent._M_extent_value;
  local_250 = this;
  if (sVar2 != 0) {
    ppCVar3 = (this->targets)._M_ptr;
    lVar10 = 0;
    do {
      lVar4 = *(long *)((long)ppCVar3 + lVar10);
      name = *(string_view *)(lVar4 + 8);
      fieldType = DeclaredType::getType((DeclaredType *)(lVar4 + 0x78));
      StructBuilder::addField(&local_218,name,fieldType,(bitmask<slang::ast::VariableFlags>)0x0);
      lVar10 = lVar10 + 8;
    } while (sVar2 << 3 != lVar10);
  }
  args_1 = local_240;
  this_00 = local_248;
  pTVar8 = BumpAllocator::
           emplace<slang::ast::TypeAliasType,char_const(&)[13],slang::SourceLocation&>
                     (&local_248->super_BumpAllocator,(char (*) [13])"CrossValType",local_240);
  this_01 = local_220;
  pCVar7 = local_230;
  (pTVar8->targetType).type = &(local_218.type)->super_Type;
  Scope::insertMember(local_220,(Symbol *)pTVar8,(local_230->super_Scope).lastMember,false,true);
  local_1f8._0_8_ = (ulong)(uint)local_1f8._4_4_ << 0x20;
  pQVar9 = BumpAllocator::emplace<slang::ast::QueueType,slang::ast::TypeAliasType&,unsigned_int>
                     (&this_00->super_BumpAllocator,pTVar8,(uint *)local_1f8);
  pTVar8 = BumpAllocator::
           emplace<slang::ast::TypeAliasType,char_const(&)[15],slang::SourceLocation&>
                     (&this_00->super_BumpAllocator,(char (*) [15])"CrossQueueType",args_1);
  (pTVar8->targetType).type = &pQVar9->super_Type;
  Scope::insertMember(this_01,(Symbol *)pTVar8,(pCVar7->super_Scope).lastMember,false,true);
  pCVar7->crossQueueType = &pTVar8->super_Type;
  local_1f8._0_8_ = local_238;
  pCVar1 = (pointer)(local_1f8 + 0x20);
  local_1f8._16_8_ = 0;
  local_1f8._24_8_ = 4;
  local_1f8._224_8_ = local_1f8 + 0x80;
  local_108 = 0x3f;
  src = (EVP_PKEY_CTX *)0x1;
  local_100 = 1;
  ppStack_f0 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>
                *)0x0;
  local_f8 = &boost::unordered::detail::foa::
              dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
              ::storage;
  local_e8 = 0;
  local_e0 = 0;
  local_d8._96_8_ = local_d8;
  local_68 = 0x3f;
  local_60 = 1;
  ppStack_50 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>
                *)0x0;
  local_58 = &boost::unordered::detail::foa::
              dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
              ::storage;
  local_48 = 0;
  local_40 = 0;
  sVar2 = (local_228->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.
          _M_extent._M_extent_value;
  local_1f8._8_8_ = pCVar1;
  local_1f8._232_8_ = local_1f8._224_8_;
  local_d8._104_8_ = local_d8._96_8_;
  if (sVar2 != 0) {
    ppMVar5 = (local_228->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>
              ._M_ptr;
    lVar10 = 0;
    do {
      syntax_00 = *(CoverageOptionSyntax **)((long)ppMVar5 + lVar10);
      if ((syntax_00->super_MemberSyntax).super_SyntaxNode.kind == CoverageOption) {
        anon_unknown.dwarf_6ac393::OptionBuilder::add((OptionBuilder *)local_1f8,syntax_00);
        src = extraout_RDX;
      }
      else {
        Scope::addMembers(this_01,(SyntaxNode *)syntax_00);
        src = extraout_RDX_00;
      }
      lVar10 = lVar10 + 8;
    } while (sVar2 << 3 != lVar10);
  }
  iVar6 = SmallVectorBase<slang::ast::CoverageOptionSetter>::copy
                    ((SmallVectorBase<slang::ast::CoverageOptionSetter> *)(local_1f8 + 8),
                     (EVP_PKEY_CTX *)*(Compilation **)local_1f8._0_8_,src);
  (local_250->options)._M_ptr = (pointer)CONCAT44(extraout_var,iVar6);
  (local_250->options)._M_extent._M_extent_value = extraout_RDX_01;
  local_258.storage = (Storage *)local_d8._104_8_;
  if (ppStack_50 !=
      (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>
       *)0x0) {
    slang::detail::hashing::
    StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>,_96UL,_16UL>
    ::deallocate(&local_258,ppStack_50,(local_60 * 0x178 + 0x186U) / 0x18);
  }
  local_258.storage = (Storage *)local_1f8._232_8_;
  if (ppStack_f0 !=
      (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>
       *)0x0) {
    slang::detail::hashing::
    StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>,_96UL,_16UL>
    ::deallocate(&local_258,ppStack_f0,(local_100 * 0x178 + 0x186U) / 0x18);
  }
  if ((pointer)local_1f8._8_8_ != pCVar1) {
    operator_delete((void *)local_1f8._8_8_);
  }
  return;
}

Assistant:

void CoverCrossSymbol::addBody(const syntax::CoverCrossSyntax& syntax, const Scope& scope) {
    auto& comp = scope.getCompilation();
    auto body = comp.emplace<CoverCrossBodySymbol>(comp, location);
    addMember(*body);

    StructBuilder valType(*body, LookupLocation::min);
    for (auto item : targets)
        valType.addField(item->name, item->declaredType.getType());

    auto valType_t = comp.emplace<TypeAliasType>("CrossValType", location);
    valType_t->targetType.setType(valType.type);
    body->addMember(*valType_t);

    auto queueType = comp.emplace<QueueType>(*valType_t, 0u);
    auto queueType_t = comp.emplace<TypeAliasType>("CrossQueueType", location);
    queueType_t->targetType.setType(*queueType);
    body->addMember(*queueType_t);
    body->crossQueueType = queueType_t;

    OptionBuilder optionBuilder(*this);
    for (auto member : syntax.members) {
        if (member->kind == SyntaxKind::CoverageOption)
            optionBuilder.add(member->as<CoverageOptionSyntax>());
        else
            body->addMembers(*member);
    }

    options = optionBuilder.get();
}